

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O2

void raw_free(Backend *be)

{
  BackendVtable *pBVar1;
  _Bool _Var2;
  
  _Var2 = is_tempseat((Seat *)be[-4].interactor);
  if (_Var2) {
    tempseat_free((Seat *)be[-4].interactor);
  }
  pBVar1 = be[-5].vt;
  if (pBVar1 != (BackendVtable *)0x0) {
    (**(code **)(pBVar1->init + 8))();
  }
  conf_free((Conf *)be[-1].vt);
  safefree(be[-2].interactor);
  safefree(be + -5);
  return;
}

Assistant:

static void raw_free(Backend *be)
{
    Raw *raw = container_of(be, Raw, backend);

    if (is_tempseat(raw->seat))
        tempseat_free(raw->seat);
    if (raw->s)
        sk_close(raw->s);
    conf_free(raw->conf);
    sfree(raw->description);
    sfree(raw);
}